

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O3

int KINSetResMonConstValue(void *kinmem,sunrealtype omegaconst)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    iVar1 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
    line = 0x24b;
  }
  else {
    if (0.0 <= omegaconst) {
      *(sunrealtype *)((long)kinmem + 0x280) = omegaconst;
      return 0;
    }
    msgfmt = "scalars < 0 illegal.";
    iVar1 = -2;
    error_code = -2;
    line = 0x255;
  }
  KINProcessError((KINMem)kinmem,error_code,line,"KINSetResMonConstValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int KINSetResMonConstValue(void* kinmem, sunrealtype omegaconst)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  /* check omegaconst */

  if (omegaconst < ZERO)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_OMEGA);
    return (KIN_ILL_INPUT);
  }

  /* Load omega value. A value of 0 will force using omega_min and omega_max */
  kin_mem->kin_omega = omegaconst;

  return (KIN_SUCCESS);
}